

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
Shell::addModule(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,WASTModule *mod)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__rhs;
  Name *__k;
  char *pcVar1;
  __shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2> *__r_00;
  undefined1 local_d8 [8];
  Result<std::shared_ptr<wasm::Module>_> module;
  undefined1 local_90 [8];
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  _val_2;
  shared_ptr<wasm::Module> wasm;
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  instanceInfo;
  
  makeModule((Result<std::shared_ptr<wasm::Module>_> *)local_d8,this,mod);
  std::__detail::__variant::_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)
                  &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (_Copy_ctor_base<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)local_d8);
  if (instanceInfo.val.
      super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
    std::__cxx11::string::string
              ((string *)local_90,
               (string *)
               &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)
                      &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     );
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)
                      &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     );
    p_Var2 = (__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
        super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_u._24_1_ == '\0')
    {
      p_Var2 = (__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)local_d8;
    }
    std::__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&_val_2.val.
                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               + 0x20),p_Var2);
    validateModule((Result<wasm::Ok> *)
                   &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   this,(Module *)
                        _val_2.val.
                        super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        ._32_8_);
    if (instanceInfo.val.
        super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
      std::__cxx11::string::string
                ((string *)local_90,
                 (string *)
                 &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      instantiate((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                   *)&wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  this,(Module *)
                       _val_2.val.
                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       ._32_8_);
      __rhs = &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         *)local_90,
                        (_Copy_ctor_base<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                         *)__rhs);
      if (_val_2.val.
          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20),
                   (string *)local_90);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20))
        ;
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&module.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20))
        ;
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             *)local_90);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             *)local_90);
        __r = (__shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (instanceInfo.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\0') {
          __r = (__shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2> *)__rhs;
        }
        __r_00 = (__shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2> *)0x10;
        if (instanceInfo.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\0') {
          __r_00 = (__shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&instanceInfo.val.
                           super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                   + 8);
        }
        __k = &this->lastModule;
        pcVar1 = *(char **)(_val_2.val.
                            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                            ._32_8_ + 0x188);
        (this->lastModule).super_IString.str._M_len =
             *(size_t *)
              (_val_2.val.
               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               ._32_8_ + 0x180);
        (this->lastModule).super_IString.str._M_str = pcVar1;
        p_Var2 = &std::
                  map<wasm::Name,_std::shared_ptr<wasm::Module>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>_>
                  ::operator[](&this->modules,__k)->
                  super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var2,(__shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&_val_2.val.
                                  super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          + 0x20));
        this_00 = &std::
                   map<wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>_>
                   ::operator[](&this->interfaces,__k)->
                   super___shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<wasm::ShellExternalInterface,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,__r);
        this_01 = &std::
                   map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
                   ::operator[](&this->instances,__k)->
                   super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>::operator=(this_01,__r_00)
        ;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           *)&wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wasm);
  }
  std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Result<> addModule(WASTModule& mod) {
    auto module = makeModule(mod);
    CHECK_ERR(module);

    auto wasm = *module;
    CHECK_ERR(validateModule(*wasm));

    auto instanceInfo = instantiate(*wasm);
    CHECK_ERR(instanceInfo);

    auto& [interface, instance] = *instanceInfo;
    lastModule = wasm->name;
    modules[lastModule] = std::move(wasm);
    interfaces[lastModule] = std::move(interface);
    instances[lastModule] = std::move(instance);

    return Ok{};
  }